

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::setEditable(QComboBox *this,bool editable)

{
  QComboBoxPrivate *this_00;
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  QComboBoxPrivateContainer *pQVar4;
  QWidget *this_01;
  QPalette *palette;
  QComboBoxPrivate *d;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  QStyleOptionComboBox QStack_b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->lineEdit != (QLineEdit *)0x0) != editable) {
    memset(&QStack_b8,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&QStack_b8);
    (**(code **)(*(long *)&this->super_QWidget + 0x1b8))(this,&QStack_b8);
    pQVar3 = QWidget::style(&this->super_QWidget);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x19,&QStack_b8,this,0);
    if (editable) {
      if (iVar2 != 0) {
        pQVar4 = QComboBoxPrivate::viewContainer(this_00);
        QComboBoxPrivateContainer::updateScrollers(pQVar4);
        pQVar4 = QComboBoxPrivate::viewContainer
                           (*(QComboBoxPrivate **)&(this->super_QWidget).field_0x8);
        QAbstractScrollArea::setVerticalScrollBarPolicy
                  ((QAbstractScrollArea *)pQVar4->view,ScrollBarAsNeeded);
      }
      this_01 = (QWidget *)operator_new(0x28);
      QLineEdit::QLineEdit((QLineEdit *)this_01,&this->super_QWidget);
      palette = QWidget::palette(&this->super_QWidget);
      QWidget::setPalette(this_01,palette);
      setLineEdit(this,(QLineEdit *)this_01);
    }
    else {
      if (iVar2 != 0) {
        pQVar4 = QComboBoxPrivate::viewContainer(this_00);
        QComboBoxPrivateContainer::updateScrollers(pQVar4);
        pQVar4 = QComboBoxPrivate::viewContainer
                           (*(QComboBoxPrivate **)&(this->super_QWidget).field_0x8);
        QAbstractScrollArea::setVerticalScrollBarPolicy
                  ((QAbstractScrollArea *)pQVar4->view,ScrollBarAlwaysOff);
      }
      QWidget::setAttribute(&this->super_QWidget,WA_InputMethodEnabled,false);
      QWidget::hide(&this_00->lineEdit->super_QWidget);
      QObject::deleteLater();
      this_00->lineEdit = (QLineEdit *)0x0;
    }
    QComboBoxPrivate::updateDelegate(this_00,false);
    pQVar4 = QComboBoxPrivate::viewContainer(this_00);
    QComboBoxPrivateContainer::updateTopBottomMargin(pQVar4);
    bVar1 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
    if (!bVar1) {
      QWidget::adjustSize(&this->super_QWidget);
    }
    QIcon::~QIcon(&QStack_b8.currentIcon);
    if (&(QStack_b8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(QStack_b8.currentText.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&QStack_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setEditable(bool editable)
{
    Q_D(QComboBox);
    if (isEditable() == editable)
        return;

    QStyleOptionComboBox opt;
    initStyleOption(&opt);
    if (editable) {
        if (style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, this)) {
            d->viewContainer()->updateScrollers();
            view()->setVerticalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        }
        QLineEdit *le = new QLineEdit(this);
        le->setPalette(palette());
        setLineEdit(le);
    } else {
        if (style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, this)) {
            d->viewContainer()->updateScrollers();
            view()->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
        }
        setAttribute(Qt::WA_InputMethodEnabled, false);
        d->lineEdit->hide();
        d->lineEdit->deleteLater();
        d->lineEdit = nullptr;
    }

    d->updateDelegate();
    d->updateFocusPolicy();

    d->viewContainer()->updateTopBottomMargin();
    if (!testAttribute(Qt::WA_Resized))
        adjustSize();
}